

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O1

void __thiscall TPZIntQuad::Point(TPZIntQuad *this,int ip,TPZVec<double> *pos,REAL *w)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ostream *this_00;
  long *plVar5;
  int i;
  int i_00;
  int i_01;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  
  if ((((this->fIntEta != (TPZGaussRule *)0x0) && (-1 < ip)) &&
      (this->fIntKsi != (TPZGaussRule *)0x0)) &&
     (iVar4 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this), ip < iVar4)) {
    lVar1 = (long)this->fIntEta->fNumInt;
    uVar2 = (long)ip / lVar1;
    uVar3 = (long)ip % lVar1;
    TPZGaussRule::Loc((longdouble *)this->fIntKsi,(TPZGaussRule *)(uVar2 & 0xffffffff),(int)uVar3);
    *pos->fStore = (double)in_ST0;
    TPZGaussRule::Loc((longdouble *)this->fIntEta,(TPZGaussRule *)(uVar3 & 0xffffffff),i);
    pos->fStore[1] = (double)in_ST1;
    TPZGaussRule::W((longdouble *)this->fIntKsi,(TPZGaussRule *)(uVar2 & 0xffffffff),i_00);
    TPZGaussRule::W((longdouble *)this->fIntEta,(TPZGaussRule *)(uVar3 & 0xffffffff),i_01);
    *w = (double)(in_ST2 * in_ST3);
    return;
  }
  if ((this->fIntKsi == (TPZGaussRule *)0x0) || (this->fIntEta == (TPZGaussRule *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Null Pointer passed to method ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZInt1d::TPZInt1d(TPZGaussRule *)\n",0x23);
  }
  if ((-1 < ip) && (iVar4 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this), ip < iVar4))
  {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ip = ",5);
  this_00 = (ostream *)std::ostream::operator<<(&std::cerr,ip);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,", Out of Range: 0 -> ",0x15);
  iVar4 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this);
  plVar5 = (long *)std::ostream::operator<<(this_00,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return;
}

Assistant:

void TPZIntQuad::Point(int ip, TPZVec<REAL> &pos, REAL &w) const {
    
#ifdef PZDEBUG
    if(pos.size() == 1 || pos.size() > 3 )
    {
        DebugStop();
    }
#endif
	if((fIntEta) && (fIntKsi) && ((ip >= 0) && (ip < NPoints()))){
		int ik, ie;
		ik = ip/fIntEta->NInt();
		ie = ip - (ip/fIntEta->NInt())*(fIntEta->NInt());
		pos[0] = fIntKsi->Loc(ik);
		pos[1] = fIntEta->Loc(ie);
		w      = fIntKsi->W(ik)*fIntEta->W(ie);
		return;
	}
	if(!fIntKsi || !fIntEta)
		PZError 	<< "Null Pointer passed to method " << "TPZInt1d::TPZInt1d(TPZGaussRule *)\n";
	if((ip < 0) || (ip >= NPoints()))
		PZError 	<< "ip = " << ip << ", Out of Range: 0 -> " << NPoints() << std::endl;
}